

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_MACDEXT_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_ParamHolderOptInput *pTVar1;
  TA_ParamHolderOutput *pTVar2;
  TA_RetCode TVar3;
  
  pTVar1 = params->optIn;
  pTVar2 = params->out;
  TVar3 = TA_MACDEXT(startIdx,endIdx,(params->in->data).inReal,(pTVar1->data).optInInteger,
                     pTVar1[1].data.optInInteger,pTVar1[2].data.optInInteger,
                     pTVar1[3].data.optInInteger,pTVar1[4].data.optInInteger,
                     pTVar1[5].data.optInInteger,outBegIdx,outNBElement,(pTVar2->data).outReal,
                     pTVar2[1].data.outReal,pTVar2[2].data.outReal);
  return TVar3;
}

Assistant:

TA_RetCode TA_MACDEXT_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MACDEXT(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */                 (TA_MAType)params->optIn[1].data.optInInteger, /* optInFastMAType*/
/* Generated */                 params->optIn[2].data.optInInteger, /* optInSlowPeriod*/
/* Generated */                 (TA_MAType)params->optIn[3].data.optInInteger, /* optInSlowMAType*/
/* Generated */                 params->optIn[4].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                 (TA_MAType)params->optIn[5].data.optInInteger, /* optInSignalMAType*/
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outMACD */
/* Generated */                 params->out[1].data.outReal, /*  outMACDSignal */
/* Generated */                 params->out[2].data.outReal /*  outMACDHist */ );
/* Generated */ }